

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdjson.cpp
# Opt level: O2

void __thiscall
simdjson::internal::unsupported_implementation::unsupported_implementation
          (unsupported_implementation *this)

{
  allocator<char> local_39;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  local_28._M_len = 0xb;
  local_28._M_str = "unsupported";
  local_38._M_len = 0x2f;
  local_38._M_str = "Unsupported CPU (no detected SIMD instructions)";
  (this->super_implementation)._vptr_implementation = (_func_int **)&PTR_name_abi_cxx11__001ed5e8;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&(this->super_implementation)._name,&local_28,&local_39);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&(this->super_implementation)._description,&local_38,&local_39);
  (this->super_implementation)._required_instruction_sets = 0;
  (this->super_implementation)._vptr_implementation = (_func_int **)&PTR_name_abi_cxx11__001ed6a0;
  return;
}

Assistant:

unsupported_implementation() : implementation("unsupported", "Unsupported CPU (no detected SIMD instructions)", 0) {}